

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O2

void verror_at(C_Parser *tokenizer,char *filename,char *input,int line_no,char *loc,char *fmt,
              __va_list_tag *ap)

{
  char *p;
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  long lVar5;
  
  lVar1 = 0;
  do {
    lVar5 = lVar1;
    p = loc + lVar5;
    if (p <= input) break;
    lVar1 = lVar5 + -1;
  } while (loc[lVar5 + -1] != '\n');
  uVar4 = -(int)lVar5;
  for (; (*loc != '\0' && (*loc != '\n')); loc = loc + 1) {
    uVar4 = uVar4 + 1;
  }
  iVar2 = error_sprintf(tokenizer,"%s:%d: ",filename,CONCAT44(in_register_0000000c,line_no));
  error_sprintf(tokenizer,"%.*s\n",(ulong)uVar4,p);
  iVar3 = C_display_width(tokenizer,p,-(int)lVar5);
  error_sprintf(tokenizer,"%*s",(ulong)(uint)(iVar2 + iVar3),"");
  error_sprintf(tokenizer,"^ ");
  error_vsprintf(tokenizer,fmt,ap);
  error_sprintf(tokenizer,"\n");
  return;
}

Assistant:

static void verror_at(C_Parser *tokenizer, char *filename, char *input, int line_no,
                      char *loc, char *fmt, va_list ap) {
  // Find a line containing `loc`.
  char *line = loc;
  while (input < line && line[-1] != '\n')
    line--;

  char *end = loc;
  while (*end && *end != '\n')
    end++;

  // Print out the line.
  int indent = error_sprintf(tokenizer, "%s:%d: ", filename, line_no);
  error_sprintf(tokenizer, "%.*s\n", (int)(end - line), line);

  // Show the error message.
  int pos = C_display_width(tokenizer, line, loc - line) + indent;

  error_sprintf(tokenizer, "%*s", pos, ""); // print pos spaces.
  error_sprintf(tokenizer, "^ ");
  error_vsprintf(tokenizer, fmt, ap);
  error_sprintf(tokenizer, "\n");
}